

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O0

void extended_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  byte bVar1;
  cs_m680x_op *op_00;
  uint16_t *in_RDX;
  m680x_info *in_RSI;
  cs_m680x_op *op;
  cs_m680x *m680x;
  
  bVar1 = (in_RSI->m680x).op_count;
  (in_RSI->m680x).op_count = bVar1 + 1;
  op_00 = (in_RSI->m680x).operands + bVar1;
  op_00->type = M680X_OP_EXTENDED;
  set_operand_size(in_RSI,op_00,'\x01');
  read_word(in_RSI,(uint16_t *)&(op_00->field_1).reg,*in_RDX);
  *in_RDX = *in_RDX + 2;
  return;
}

Assistant:

static void extended_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_EXTENDED;
	set_operand_size(info, op, 1);
	read_word(info, &op->ext.address, *address);
	*address += 2;
}